

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3GetToken(uchar *z,int *tokenType)

{
  uchar *puVar1;
  bool bVar2;
  long lVar3;
  uchar uVar4;
  int iVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  byte bVar10;
  int iVar11;
  byte *pbVar12;
  ulong uVar13;
  
  bVar10 = *z;
  switch(bVar10) {
  case 0x20:
    goto switchD_0013caa0_caseD_20;
  case 0x21:
    if (z[1] == '=') {
LAB_0013cf12:
      *tokenType = 0x4e;
    }
    else {
      *tokenType = 0x96;
    }
    goto LAB_0013cfd8;
  case 0x22:
  case 0x27:
  case 0x60:
    uVar13 = 1;
    bVar7 = z[1];
    while (iVar5 = (int)uVar13, bVar7 != 0) {
      if (bVar7 == bVar10) {
        lVar9 = (long)iVar5;
        uVar13 = lVar9 + 1;
        iVar5 = (int)uVar13;
        if (z[lVar9 + 1] != bVar10) {
          if (bVar10 == 0x27) {
            *tokenType = 0x61;
          }
          else {
            *tokenType = 0x1b;
          }
          goto LAB_0013cfec;
        }
      }
      uVar13 = (long)iVar5 + 1;
      bVar7 = z[(long)iVar5 + 1];
    }
    goto LAB_0013cc6e;
  case 0x23:
  case 0x24:
  case 0x3a:
  case 0x40:
    *tokenType = 0x87;
    bVar10 = z[1];
    uVar13 = 1;
    if (bVar10 != 0) {
      iVar5 = 0;
      do {
        iVar11 = (int)uVar13;
        if ((""[bVar10] & 0x46) == 0) {
          if (0 < iVar5 && bVar10 == 0x28) {
            pbVar12 = z + iVar11;
            uVar13 = (ulong)(iVar11 + 1);
            goto LAB_0013cf85;
          }
          if ((bVar10 != 0x3a) || (z[(long)iVar11 + 1] != ':')) break;
          iVar11 = iVar11 + 1;
        }
        else {
          iVar5 = iVar5 + 1;
        }
        bVar10 = z[(long)iVar11 + 1];
        uVar13 = (long)iVar11 + 1;
      } while (bVar10 != 0);
      if (iVar5 != 0) goto LAB_0013cfec;
    }
LAB_0013cc6e:
    *tokenType = 0x96;
    goto LAB_0013cfec;
  case 0x25:
    *tokenType = 0x5d;
    break;
  case 0x26:
    *tokenType = 0x55;
    break;
  case 0x28:
    *tokenType = 0x16;
    break;
  case 0x29:
    *tokenType = 0x17;
    break;
  case 0x2a:
    *tokenType = 0x5b;
    break;
  case 0x2b:
    *tokenType = 0x59;
    break;
  case 0x2c:
    *tokenType = 0x1a;
    break;
  case 0x2d:
    if (z[1] != '-') {
      *tokenType = 0x5a;
      break;
    }
    for (uVar13 = 2; (z[uVar13] != '\0' && (z[uVar13] != '\n')); uVar13 = uVar13 + 1) {
    }
    goto LAB_0013cbf4;
  case 0x2e:
    if (0xfffffffffffffff5 < (ulong)z[1] - 0x3a) goto switchD_0013caa0_caseD_30;
    *tokenType = 0x7a;
    break;
  case 0x2f:
    if ((z[1] == '*') && (z[2] != '\0')) {
      uVar13 = 4;
      if (z[3] != '/' || z[2] != '*') {
        lVar9 = 0;
        uVar4 = z[3];
        do {
          if (uVar4 == '\0') {
            uVar13 = (ulong)((int)lVar9 + 3);
            goto LAB_0013cbf4;
          }
          lVar3 = lVar9 + 4;
          lVar9 = lVar9 + 1;
          bVar2 = uVar4 != '*';
          uVar4 = z[lVar3];
        } while (z[lVar3] != '/' || bVar2);
        uVar13 = (ulong)((int)lVar9 + 4);
      }
      goto LAB_0013cbf4;
    }
    *tokenType = 0x5c;
    break;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
switchD_0013caa0_caseD_30:
    *tokenType = 0x84;
    if (((*z == '0') && ((z[1] | 0x20) == 0x78)) && ((""[z[2]] & 8) != 0)) {
      lVar9 = 3;
      do {
        pbVar12 = z + lVar9;
        lVar9 = lVar9 + 1;
      } while ((""[*pbVar12] & 8) != 0);
      uVar13 = (ulong)((int)lVar9 - 1);
    }
    else {
      uVar13 = 0xffffffffffffffff;
      do {
        lVar9 = uVar13 + 1;
        uVar13 = uVar13 + 1;
      } while (0xfffffffffffffff5 < (ulong)z[lVar9] - 0x3a);
      if (z[lVar9] == 0x2e) {
        do {
          lVar9 = uVar13 + 1;
          uVar13 = uVar13 + 1;
        } while (0xfffffffffffffff5 < (ulong)z[lVar9] - 0x3a);
        *tokenType = 0x85;
      }
      uVar6 = (ulong)(int)uVar13;
      uVar8 = (ulong)z[uVar6];
      if (((z[uVar6] | 0x20) == 0x65) &&
         ((bVar10 = z[uVar6 + 1], 0xfffffffffffffff5 < (ulong)bVar10 - 0x3a ||
          (((bVar10 == 0x2d || (bVar10 == 0x2b)) &&
           (0xfffffffffffffff5 < (ulong)z[uVar6 + 2] - 0x3a)))))) {
        lVar9 = uVar13 << 0x20;
        uVar13 = (lVar9 + 0x200000000 >> 0x20) - 1;
        lVar9 = lVar9 + 0x100000000;
        do {
          lVar3 = uVar13 + 1;
          uVar13 = uVar13 + 1;
          lVar9 = lVar9 + 0x100000000;
        } while (0xfffffffffffffff5 < (ulong)z[lVar3] - 0x3a);
        *tokenType = 0x85;
        uVar6 = lVar9 >> 0x20;
        uVar8 = (ulong)z[uVar6];
      }
      if ((""[uVar8] & 0x46) != 0) {
        pbVar12 = z + uVar6;
        uVar13 = uVar6 & 0xffffffff;
        do {
          pbVar12 = pbVar12 + 1;
          *tokenType = 0x96;
          uVar13 = (ulong)((int)uVar13 + 1);
        } while ((""[*pbVar12] & 0x46) != 0);
      }
    }
    goto LAB_0013cfec;
  case 0x3b:
    *tokenType = 1;
    break;
  case 0x3c:
    uVar4 = z[1];
    if (uVar4 == '<') {
      *tokenType = 0x57;
    }
    else {
      if (uVar4 == '>') goto LAB_0013cf12;
      if (uVar4 != '=') {
        *tokenType = 0x52;
        break;
      }
      *tokenType = 0x51;
    }
    goto LAB_0013cfd8;
  case 0x3d:
    *tokenType = 0x4f;
    uVar13 = (ulong)((z[1] == '=') + 1);
    goto LAB_0013cfec;
  case 0x3e:
    if (z[1] == '>') {
      *tokenType = 0x58;
    }
    else {
      if (z[1] != '=') {
        *tokenType = 0x50;
        break;
      }
      *tokenType = 0x53;
    }
    goto LAB_0013cfd8;
  case 0x3f:
    *tokenType = 0x87;
    uVar13 = 0;
    do {
      lVar9 = uVar13 + 1;
      uVar13 = uVar13 + 1;
    } while (0xfffffffffffffff5 < (ulong)z[lVar9] - 0x3a);
    goto LAB_0013cfec;
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x59:
  case 0x5a:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7d:
    goto switchD_0013caa0_caseD_41;
  case 0x58:
  case 0x78:
    if (z[1] == '\'') {
      *tokenType = 0x86;
      uVar13 = 1;
      do {
        lVar9 = uVar13 + 1;
        uVar13 = uVar13 + 1;
      } while ((""[z[lVar9]] & 8) != 0);
      if ((uVar13 & 1) != 0 || z[lVar9] != 0x27) {
        *tokenType = 0x96;
        for (; (z[uVar13] != '\0' && (z[uVar13] != '\'')); uVar13 = uVar13 + 1) {
        }
      }
      uVar13 = (ulong)(((int)uVar13 + 1) - (uint)(z[(int)uVar13] == '\0'));
      goto LAB_0013cfec;
    }
switchD_0013caa0_caseD_41:
    if ((""[bVar10] & 0x46) != 0) {
      uVar13 = 0;
      do {
        lVar9 = uVar13 + 1;
        uVar13 = uVar13 + 1;
      } while ((""[z[lVar9]] & 0x46) != 0);
      iVar5 = keywordCode((char *)z,(int)uVar13);
LAB_0013cf41:
      *tokenType = iVar5;
      goto LAB_0013cfec;
    }
    *tokenType = 0x96;
    break;
  case 0x5b:
    uVar13 = 1;
    do {
      puVar1 = z + uVar13;
      if (*puVar1 == '\0') {
        iVar5 = 0x96;
        goto LAB_0013cf41;
      }
      uVar13 = uVar13 + 1;
    } while (*puVar1 != ']');
    iVar5 = 0x1b;
    goto LAB_0013cf41;
  case 0x7c:
    if (z[1] != '|') {
      *tokenType = 0x56;
      break;
    }
    *tokenType = 0x5e;
LAB_0013cfd8:
    uVar13 = 2;
    goto LAB_0013cfec;
  case 0x7e:
    *tokenType = 0x60;
    break;
  default:
    if ((0xd < bVar10) || ((0x3600U >> (bVar10 & 0x1f) & 1) == 0)) goto switchD_0013caa0_caseD_41;
    goto switchD_0013caa0_caseD_20;
  }
  uVar13 = 1;
LAB_0013cfec:
  return (int)uVar13;
  while ((uVar13 = (ulong)((int)uVar8 + 1), uVar6 != 0x29 && ((""[uVar6] & 1) == 0))) {
LAB_0013cf85:
    uVar8 = uVar13;
    pbVar12 = pbVar12 + 1;
    uVar6 = (ulong)*pbVar12;
    if (uVar6 == 0) goto LAB_0013cfaf;
  }
  if (*pbVar12 != 0x29) {
LAB_0013cfaf:
    *tokenType = 0x96;
    uVar13 = uVar8;
  }
  goto LAB_0013cfec;
switchD_0013caa0_caseD_20:
  uVar13 = 0;
  do {
    lVar9 = uVar13 + 1;
    uVar13 = uVar13 + 1;
  } while ((""[z[lVar9]] & 1) != 0);
LAB_0013cbf4:
  *tokenType = 0x97;
  goto LAB_0013cfec;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetToken(const unsigned char *z, int *tokenType){
  int i, c;
  switch( *z ){
    case ' ': case '\t': case '\n': case '\f': case '\r': {
      testcase( z[0]==' ' );
      testcase( z[0]=='\t' );
      testcase( z[0]=='\n' );
      testcase( z[0]=='\f' );
      testcase( z[0]=='\r' );
      for(i=1; sqlite3Isspace(z[i]); i++){}
      *tokenType = TK_SPACE;
      return i;
    }
    case '-': {
      if( z[1]=='-' ){
        for(i=2; (c=z[i])!=0 && c!='\n'; i++){}
        *tokenType = TK_SPACE;   /* IMP: R-22934-25134 */
        return i;
      }
      *tokenType = TK_MINUS;
      return 1;
    }
    case '(': {
      *tokenType = TK_LP;
      return 1;
    }
    case ')': {
      *tokenType = TK_RP;
      return 1;
    }
    case ';': {
      *tokenType = TK_SEMI;
      return 1;
    }
    case '+': {
      *tokenType = TK_PLUS;
      return 1;
    }
    case '*': {
      *tokenType = TK_STAR;
      return 1;
    }
    case '/': {
      if( z[1]!='*' || z[2]==0 ){
        *tokenType = TK_SLASH;
        return 1;
      }
      for(i=3, c=z[2]; (c!='*' || z[i]!='/') && (c=z[i])!=0; i++){}
      if( c ) i++;
      *tokenType = TK_SPACE;   /* IMP: R-22934-25134 */
      return i;
    }
    case '%': {
      *tokenType = TK_REM;
      return 1;
    }
    case '=': {
      *tokenType = TK_EQ;
      return 1 + (z[1]=='=');
    }
    case '<': {
      if( (c=z[1])=='=' ){
        *tokenType = TK_LE;
        return 2;
      }else if( c=='>' ){
        *tokenType = TK_NE;
        return 2;
      }else if( c=='<' ){
        *tokenType = TK_LSHIFT;
        return 2;
      }else{
        *tokenType = TK_LT;
        return 1;
      }
    }
    case '>': {
      if( (c=z[1])=='=' ){
        *tokenType = TK_GE;
        return 2;
      }else if( c=='>' ){
        *tokenType = TK_RSHIFT;
        return 2;
      }else{
        *tokenType = TK_GT;
        return 1;
      }
    }
    case '!': {
      if( z[1]!='=' ){
        *tokenType = TK_ILLEGAL;
        return 2;
      }else{
        *tokenType = TK_NE;
        return 2;
      }
    }
    case '|': {
      if( z[1]!='|' ){
        *tokenType = TK_BITOR;
        return 1;
      }else{
        *tokenType = TK_CONCAT;
        return 2;
      }
    }
    case ',': {
      *tokenType = TK_COMMA;
      return 1;
    }
    case '&': {
      *tokenType = TK_BITAND;
      return 1;
    }
    case '~': {
      *tokenType = TK_BITNOT;
      return 1;
    }
    case '`':
    case '\'':
    case '"': {
      int delim = z[0];
      testcase( delim=='`' );
      testcase( delim=='\'' );
      testcase( delim=='"' );
      for(i=1; (c=z[i])!=0; i++){
        if( c==delim ){
          if( z[i+1]==delim ){
            i++;
          }else{
            break;
          }
        }
      }
      if( c=='\'' ){
        *tokenType = TK_STRING;
        return i+1;
      }else if( c!=0 ){
        *tokenType = TK_ID;
        return i+1;
      }else{
        *tokenType = TK_ILLEGAL;
        return i;
      }
    }
    case '.': {
#ifndef SQLITE_OMIT_FLOATING_POINT
      if( !sqlite3Isdigit(z[1]) )
#endif
      {
        *tokenType = TK_DOT;
        return 1;
      }
      /* If the next character is a digit, this is a floating point
      ** number that begins with ".".  Fall thru into the next case */
    }
    case '0': case '1': case '2': case '3': case '4':
    case '5': case '6': case '7': case '8': case '9': {
      testcase( z[0]=='0' );  testcase( z[0]=='1' );  testcase( z[0]=='2' );
      testcase( z[0]=='3' );  testcase( z[0]=='4' );  testcase( z[0]=='5' );
      testcase( z[0]=='6' );  testcase( z[0]=='7' );  testcase( z[0]=='8' );
      testcase( z[0]=='9' );
      *tokenType = TK_INTEGER;
#ifndef SQLITE_OMIT_HEX_INTEGER
      if( z[0]=='0' && (z[1]=='x' || z[1]=='X') && sqlite3Isxdigit(z[2]) ){
        for(i=3; sqlite3Isxdigit(z[i]); i++){}
        return i;
      }
#endif
      for(i=0; sqlite3Isdigit(z[i]); i++){}
#ifndef SQLITE_OMIT_FLOATING_POINT
      if( z[i]=='.' ){
        i++;
        while( sqlite3Isdigit(z[i]) ){ i++; }
        *tokenType = TK_FLOAT;
      }
      if( (z[i]=='e' || z[i]=='E') &&
           ( sqlite3Isdigit(z[i+1]) 
            || ((z[i+1]=='+' || z[i+1]=='-') && sqlite3Isdigit(z[i+2]))
           )
      ){
        i += 2;
        while( sqlite3Isdigit(z[i]) ){ i++; }
        *tokenType = TK_FLOAT;
      }
#endif
      while( IdChar(z[i]) ){
        *tokenType = TK_ILLEGAL;
        i++;
      }
      return i;
    }
    case '[': {
      for(i=1, c=z[0]; c!=']' && (c=z[i])!=0; i++){}
      *tokenType = c==']' ? TK_ID : TK_ILLEGAL;
      return i;
    }
    case '?': {
      *tokenType = TK_VARIABLE;
      for(i=1; sqlite3Isdigit(z[i]); i++){}
      return i;
    }
#ifndef SQLITE_OMIT_TCL_VARIABLE
    case '$':
#endif
    case '@':  /* For compatibility with MS SQL Server */
    case '#':
    case ':': {
      int n = 0;
      testcase( z[0]=='$' );  testcase( z[0]=='@' );
      testcase( z[0]==':' );  testcase( z[0]=='#' );
      *tokenType = TK_VARIABLE;
      for(i=1; (c=z[i])!=0; i++){
        if( IdChar(c) ){
          n++;
#ifndef SQLITE_OMIT_TCL_VARIABLE
        }else if( c=='(' && n>0 ){
          do{
            i++;
          }while( (c=z[i])!=0 && !sqlite3Isspace(c) && c!=')' );
          if( c==')' ){
            i++;
          }else{
            *tokenType = TK_ILLEGAL;
          }
          break;
        }else if( c==':' && z[i+1]==':' ){
          i++;
#endif
        }else{
          break;
        }
      }
      if( n==0 ) *tokenType = TK_ILLEGAL;
      return i;
    }
#ifndef SQLITE_OMIT_BLOB_LITERAL
    case 'x': case 'X': {
      testcase( z[0]=='x' ); testcase( z[0]=='X' );
      if( z[1]=='\'' ){
        *tokenType = TK_BLOB;
        for(i=2; sqlite3Isxdigit(z[i]); i++){}
        if( z[i]!='\'' || i%2 ){
          *tokenType = TK_ILLEGAL;
          while( z[i] && z[i]!='\'' ){ i++; }
        }
        if( z[i] ) i++;
        return i;
      }
      /* Otherwise fall through to the next case */
    }
#endif
    default: {
      if( !IdChar(*z) ){
        break;
      }
      for(i=1; IdChar(z[i]); i++){}
      *tokenType = keywordCode((char*)z, i);
      return i;
    }
  }
  *tokenType = TK_ILLEGAL;
  return 1;
}